

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::trim(string *__return_storage_ptr__,string *str)

{
  size_type __pos;
  size_type sVar1;
  size_type end;
  size_type start;
  string *str_local;
  
  __pos = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of(str,trim::whitespaceChars,0);
  sVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(str,trim::whitespaceChars,0xffffffffffffffff);
  if (__pos == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,str,__pos,(sVar1 + 1) - __pos);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim( std::string const& str ) {
        static char const* whitespaceChars = "\n\r\t ";
        std::string::size_type start = str.find_first_not_of( whitespaceChars );
        std::string::size_type end = str.find_last_not_of( whitespaceChars );

        return start != std::string::npos ? str.substr( start, 1+end-start ) : std::string();
    }